

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Expr * sqlite3ExprAnd(Parse *pParse,Expr *pLeft,Expr *pRight)

{
  sqlite3 *db;
  Expr *pEVar1;
  
  pEVar1 = pRight;
  if ((pLeft == (Expr *)0x0) || (pEVar1 = pLeft, pRight == (Expr *)0x0)) {
    return pEVar1;
  }
  db = pParse->db;
  if (((pLeft->flags & 0x20000001) != 0x20000000) && ((pRight->flags & 0x20000001) != 0x20000000)) {
    pEVar1 = sqlite3PExpr(pParse,0x2c,pLeft,pRight);
    return pEVar1;
  }
  sqlite3ExprUnmapAndDelete(pParse,pLeft);
  sqlite3ExprUnmapAndDelete(pParse,pRight);
  pEVar1 = sqlite3ExprAlloc(db,0x93,sqlite3IntTokens,0);
  return pEVar1;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3ExprAnd(Parse *pParse, Expr *pLeft, Expr *pRight){
  sqlite3 *db = pParse->db;
  if( pLeft==0  ){
    return pRight;
  }else if( pRight==0 ){
    return pLeft;
  }else if( ExprAlwaysFalse(pLeft) || ExprAlwaysFalse(pRight) ){
    sqlite3ExprUnmapAndDelete(pParse, pLeft);
    sqlite3ExprUnmapAndDelete(pParse, pRight);
    return sqlite3ExprAlloc(db, TK_INTEGER, &sqlite3IntTokens[0], 0);
  }else{
    return sqlite3PExpr(pParse, TK_AND, pLeft, pRight);
  }
}